

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(unsigned_long_long lhs,
         SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  char cVar2;
  char in_SIL;
  unsigned_long_long in_RDI;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *unaff_retaddr;
  unsigned_long_long ret;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_00000016;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  undefined7 in_stack_ffffffffffffffd8;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_11;
  unsigned_long_long local_10;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2;
  char local_1;
  
  local_10 = in_RDI;
  local_2.m_int = in_SIL;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_11);
  bVar1 = DivisionCornerCaseHelper<char,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::DivisionCornerCase1(ret,in_stack_00000016,unaff_retaddr);
  if (bVar1) {
    local_1 = local_11.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<char,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::DivisionCornerCase2(local_10,local_2,&local_11);
    if (bVar1) {
      local_1 = local_11.m_int;
    }
    else {
      this = (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)0x0;
      cVar2 = SafeInt::operator_cast_to_char
                        ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)0x0);
      DivisionHelper<unsigned_long_long,char,1>::
      DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                ((unsigned_long_long *)this,(char *)CONCAT17(cVar2,in_stack_ffffffffffffffd8),
                 (unsigned_long_long *)0x12079d);
      SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<unsigned_long_long>
                (this,(unsigned_long_long *)CONCAT17(cVar2,in_stack_ffffffffffffffd8));
    }
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}